

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O3

void __thiscall
GOESRImageHandler::overlayMaps(GOESRImageHandler *this,GOESRProduct *product,Mat *mat)

{
  return;
}

Assistant:

void GOESRImageHandler::overlayMaps(const GOESRProduct& product, cv::Mat& mat) {
#ifdef HAS_PROJ
  if (config_.maps.empty()) {
    return;
  }

  auto inh = product.getHeader<lrit::ImageNavigationHeader>();
  auto lon = inh.getLongitude();

  // GOES-16 reports -75.2 but is actually at -75.0
  if (fabsf(lon - (-75.2)) < 1e-3) {
    lon = -75.0;
  }

  // GOES-17 reports -137.2 but is actually at -137.0
  if (fabsf(lon - (-137.2)) < 1e-3) {
    lon = -137.0;
  }

  // TODO: The map drawer should be cached by construction parameters.
  auto drawer = MapDrawer(&config_, lon, inh);
  mat = drawer.draw(mat);
#endif
}